

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reduce.cpp
# Opt level: O0

void __thiscall tst_helpers_reduce::emptySequence(tst_helpers_reduce *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  bool local_65 [5];
  int local_60 [4];
  bool *local_50;
  QList<int> local_48;
  undefined1 local_28 [8];
  Type p;
  bool called;
  tst_helpers_reduce *this_local;
  
  p.super_QPromiseBase<int>.m_d.d._7_1_ = 0;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (int *)0x0;
  local_48.d.size = 0;
  QList<int>::QList(&local_48);
  local_50 = (bool *)((long)&p.super_QPromiseBase<int>.m_d.d + 7);
  QtPromise::
  reduce<int,_QList,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_tests_auto_qtpromise_helpers_tst_reduce_cpp:78:9),_int>
            ((QtPromise *)local_28,&local_48,(anon_class_8_1_4f9d58bb)local_50,0x2a);
  QList<int>::~QList(&local_48);
  local_60[0] = -1;
  iVar3 = waitForValue<int>((QPromise<int> *)local_28,local_60);
  bVar1 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                          ,0x58);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    local_65[0] = false;
    bVar2 = QTest::qCompare<bool,bool>
                      ((bool *)((long)&p.super_QPromiseBase<int>.m_d.d + 7),local_65,"called",
                       "false",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                       ,0x59);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_65[1] = false;
      local_65[2] = false;
      local_65[3] = false;
      local_65[4] = false;
    }
    else {
      local_65[1] = true;
      local_65[2] = false;
      local_65[3] = false;
      local_65[4] = false;
    }
  }
  else {
    local_65[1] = true;
    local_65[2] = false;
    local_65[3] = false;
    local_65[4] = false;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_28);
  return;
}

Assistant:

void tst_helpers_reduce::emptySequence()
{
    bool called = false;

    auto p = QtPromise::reduce(
        QVector<int>{},
        [&](...) {
            called = true;
            return 43;
        },
        42);

    // NOTE(SB): reduce() on an empty sequence without an initial value is an error!

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(called, false);
}